

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtGenericNodeCheck(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  _xmlDoc *p_Var1;
  _xmlDict *p_Var2;
  _xmlNode *p_Var3;
  uchar *utf;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  char *pcVar7;
  xmlNs *ns;
  
  p_Var1 = node->doc;
  if (node->parent == (_xmlNode *)0x0) {
    xmlDebugErr(ctxt,0x1395,"Node has no parent\n");
  }
  if (node->doc == (_xmlDoc *)0x0) {
    xmlDebugErr(ctxt,0x1396,"Node has no doc\n");
  }
  else {
    p_Var2 = p_Var1->dict;
    if ((p_Var2 == (_xmlDict *)0x0) && (ctxt->nodict == 0)) {
      ctxt->nodict = 1;
    }
    if (ctxt->doc == (xmlDocPtr)0x0) {
      ctxt->doc = p_Var1;
    }
    if (ctxt->dict == (xmlDictPtr)0x0) {
      ctxt->dict = p_Var2;
    }
  }
  if (((node->parent != (_xmlNode *)0x0) && (node->doc != node->parent->doc)) &&
     (iVar4 = xmlStrEqual(node->name,(xmlChar *)"pseudoroot"), iVar4 == 0)) {
    xmlDebugErr(ctxt,0x1399,"Node doc differs from parent\'s one\n");
  }
  if (node->prev == (_xmlNode *)0x0) {
    p_Var3 = node->parent;
    if (node->type == XML_ATTRIBUTE_NODE) {
      if ((p_Var3 != (_xmlNode *)0x0) && ((xmlNodePtr)p_Var3->properties != node)) {
        pcVar7 = "Attr has no prev and not first of attr list\n";
LAB_00140d04:
        iVar4 = 0x139a;
        goto LAB_00140d0c;
      }
    }
    else if ((p_Var3 != (_xmlNode *)0x0) && (p_Var3->children != node)) {
      pcVar7 = "Node has no prev and not first of parent list\n";
      goto LAB_00140d04;
    }
  }
  else {
    if (node->prev->next == node) goto LAB_00140d11;
    pcVar7 = "Node prev->next : back link wrong\n";
    iVar4 = 0x139b;
LAB_00140d0c:
    xmlDebugErr(ctxt,iVar4,pcVar7);
  }
LAB_00140d11:
  if (node->next == (_xmlNode *)0x0) {
    p_Var3 = node->parent;
    if ((((p_Var3 != (_xmlNode *)0x0) && (node->type != XML_ATTRIBUTE_NODE)) &&
        (p_Var3->last != node)) && (p_Var3->type == XML_ELEMENT_NODE)) {
      pcVar7 = "Node has no next and not last of parent list\n";
      iVar4 = 0x139c;
      goto LAB_00140d51;
    }
  }
  else {
    if (node->next->prev != node) {
      xmlDebugErr(ctxt,0x139d,"Node next->prev : forward link wrong\n");
    }
    if (node->next->parent != node->parent) {
      pcVar7 = "Node next->prev : forward link wrong\n";
      iVar4 = 0x13a5;
LAB_00140d51:
      xmlDebugErr(ctxt,iVar4,pcVar7);
    }
  }
  if (node->type == XML_ATTRIBUTE_NODE) {
LAB_00140daf:
    if (node->ns != (xmlNsPtr)0x0) {
      xmlCtxtNsCheckScope(ctxt,node,node->ns);
    }
  }
  else if (node->type == XML_ELEMENT_NODE) {
    for (ns = node->nsDef; ns != (xmlNsPtr)0x0; ns = ns->next) {
      xmlCtxtNsCheckScope(ctxt,node,ns);
    }
    goto LAB_00140daf;
  }
  if (((XML_ATTRIBUTE_DECL < node->type) ||
      ((0x1e206U >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
     ((utf = node->content, utf != (uchar *)0x0 &&
      ((ctxt->check != 0 && (iVar4 = xmlCheckUTF8(utf), iVar4 == 0)))))) {
    xmlDebugErr3(ctxt,0x13a8,"String is not UTF-8 %s",(char *)utf);
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_ATTRIBUTE_NODE:
  case XML_PI_NODE:
    xmlCtxtCheckName(ctxt,node->name);
    return;
  case XML_TEXT_NODE:
    pxVar6 = node->name;
    if (pxVar6 == "textnoenc" || pxVar6 == "text") {
      return;
    }
    if ((ctxt->dict != (xmlDictPtr)0x0) &&
       (pxVar5 = xmlDictLookup(ctxt->dict,(xmlChar *)"nbktext",7), pxVar6 == pxVar5)) {
      return;
    }
    pxVar6 = node->name;
    pcVar7 = "Text node has wrong name \'%s\'";
    break;
  case XML_CDATA_SECTION_NODE:
    pxVar6 = node->name;
    if (pxVar6 == (xmlChar *)0x0) {
      return;
    }
    pcVar7 = "CData section has non NULL name \'%s\'";
    iVar4 = 0x13ad;
    goto LAB_00140e8f;
  default:
    return;
  case XML_COMMENT_NODE:
    pxVar6 = node->name;
    if (pxVar6 == "comment") {
      return;
    }
    pcVar7 = "Comment node has wrong name \'%s\'";
  }
  iVar4 = 0x13ac;
LAB_00140e8f:
  xmlDebugErr3(ctxt,iVar4,pcVar7,(char *)pxVar6);
  return;
}

Assistant:

static void
xmlCtxtGenericNodeCheck(xmlDebugCtxtPtr ctxt, xmlNodePtr node) {
    xmlDocPtr doc;
    xmlDictPtr dict;

    doc = node->doc;

    if (node->parent == NULL)
        xmlDebugErr(ctxt, XML_CHECK_NO_PARENT,
	            "Node has no parent\n");
    if (node->doc == NULL) {
        xmlDebugErr(ctxt, XML_CHECK_NO_DOC,
	            "Node has no doc\n");
        dict = NULL;
    } else {
	dict = doc->dict;
	if ((dict == NULL) && (ctxt->nodict == 0)) {
#if 0
            /* deactivated right now as it raises too many errors */
	    if (doc->type == XML_DOCUMENT_NODE)
		xmlDebugErr(ctxt, XML_CHECK_NO_DICT,
			    "Document has no dictionary\n");
#endif
	    ctxt->nodict = 1;
	}
	if (ctxt->doc == NULL)
	    ctxt->doc = doc;

	if (ctxt->dict == NULL) {
	    ctxt->dict = dict;
	}
    }
    if ((node->parent != NULL) && (node->doc != node->parent->doc) &&
        (!xmlStrEqual(node->name, BAD_CAST "pseudoroot")))
        xmlDebugErr(ctxt, XML_CHECK_WRONG_DOC,
	            "Node doc differs from parent's one\n");
    if (node->prev == NULL) {
        if (node->type == XML_ATTRIBUTE_NODE) {
	    if ((node->parent != NULL) &&
	        (node != (xmlNodePtr) node->parent->properties))
		xmlDebugErr(ctxt, XML_CHECK_NO_PREV,
                    "Attr has no prev and not first of attr list\n");

        } else if ((node->parent != NULL) && (node->parent->children != node))
	    xmlDebugErr(ctxt, XML_CHECK_NO_PREV,
                    "Node has no prev and not first of parent list\n");
    } else {
        if (node->prev->next != node)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_PREV,
                        "Node prev->next : back link wrong\n");
    }
    if (node->next == NULL) {
	if ((node->parent != NULL) && (node->type != XML_ATTRIBUTE_NODE) &&
	    (node->parent->last != node) &&
	    (node->parent->type == XML_ELEMENT_NODE))
	    xmlDebugErr(ctxt, XML_CHECK_NO_NEXT,
                    "Node has no next and not last of parent list\n");
    } else {
        if (node->next->prev != node)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_NEXT,
                    "Node next->prev : forward link wrong\n");
        if (node->next->parent != node->parent)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_PARENT,
                    "Node next->prev : forward link wrong\n");
    }
    if (node->type == XML_ELEMENT_NODE) {
        xmlNsPtr ns;

	ns = node->nsDef;
	while (ns != NULL) {
	    xmlCtxtNsCheckScope(ctxt, node, ns);
	    ns = ns->next;
	}
	if (node->ns != NULL)
	    xmlCtxtNsCheckScope(ctxt, node, node->ns);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
	if (node->ns != NULL)
	    xmlCtxtNsCheckScope(ctxt, node, node->ns);
    }

    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE) &&
	(node->type != XML_ELEMENT_DECL) &&
	(node->type != XML_ATTRIBUTE_DECL) &&
	(node->type != XML_DTD_NODE) &&
	(node->type != XML_HTML_DOCUMENT_NODE) &&
	(node->type != XML_DOCUMENT_NODE)) {
	if (node->content != NULL)
	    xmlCtxtCheckString(ctxt, (const xmlChar *) node->content);
    }
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    xmlCtxtCheckName(ctxt, node->name);
	    break;
        case XML_TEXT_NODE:
	    if ((node->name == xmlStringText) ||
	        (node->name == xmlStringTextNoenc))
		break;
	    /* some case of entity substitution can lead to this */
	    if ((ctxt->dict != NULL) &&
	        (node->name == xmlDictLookup(ctxt->dict, BAD_CAST "nbktext",
		                             7)))
		break;

	    xmlDebugErr3(ctxt, XML_CHECK_WRONG_NAME,
			 "Text node has wrong name '%s'",
			 (const char *) node->name);
	    break;
        case XML_COMMENT_NODE:
	    if (node->name == xmlStringComment)
		break;
	    xmlDebugErr3(ctxt, XML_CHECK_WRONG_NAME,
			 "Comment node has wrong name '%s'",
			 (const char *) node->name);
	    break;
        case XML_PI_NODE:
	    xmlCtxtCheckName(ctxt, node->name);
	    break;
        case XML_CDATA_SECTION_NODE:
	    if (node->name == NULL)
		break;
	    xmlDebugErr3(ctxt, XML_CHECK_NAME_NOT_NULL,
			 "CData section has non NULL name '%s'",
			 (const char *) node->name);
	    break;
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_NAMESPACE_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    break;
    }
}